

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

Expected<llvm::DWARFDebugNames::Entry> * __thiscall
llvm::DWARFDebugNames::NameIndex::getEntry
          (Expected<llvm::DWARFDebugNames::Entry> *__return_storage_ptr__,NameIndex *this,
          uint64_t *Offset)

{
  bool bVar1;
  uint64_t uVar2;
  Abbrev *Abbr;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code local_190;
  Error local_180;
  FormParams local_174;
  iterator local_170;
  DWARFFormValue *Value;
  iterator __end1;
  iterator __begin1;
  SmallVector<llvm::DWARFFormValue,_3U> *__range1;
  undefined1 local_148 [4];
  FormParams FormParams;
  Entry E;
  char *local_88;
  Error local_80;
  const_iterator local_78;
  undefined1 local_68 [8];
  const_iterator AbbrevIt;
  uint local_50 [2];
  uint32_t AbbrevCode;
  error_code local_40;
  Error local_30;
  DWARFDataExtractor *local_28;
  DWARFDataExtractor *AS;
  uint64_t *Offset_local;
  NameIndex *this_local;
  
  local_28 = &(this->Section->super_DWARFAcceleratorTable).AccelSection;
  AS = (DWARFDataExtractor *)Offset;
  Offset_local = (uint64_t *)this;
  this_local = (NameIndex *)__return_storage_ptr__;
  bVar1 = DataExtractor::isValidOffset(&local_28->super_DataExtractor,*Offset);
  if (bVar1) {
    uVar2 = DataExtractor::getULEB128(&local_28->super_DataExtractor,(uint64_t *)AS,(Error *)0x0);
    local_50[0] = (uint)uVar2;
    if (local_50[0] == 0) {
      make_error<llvm::DWARFDebugNames::SentinelError>();
      Expected<llvm::DWARFDebugNames::Entry>::Expected
                (__return_storage_ptr__,(Error *)&AbbrevIt.I.End);
      Error::~Error((Error *)&AbbrevIt.I.End);
    }
    else {
      _local_68 = (const_iterator)
                  detail::
                  DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                  ::find_as<unsigned_int>
                            ((DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                              *)this,local_50);
      local_78 = (const_iterator)
                 detail::
                 DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                 ::end((DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                        *)this);
      bVar1 = detail::
              DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
              ::ConstIterator::operator==((ConstIterator *)local_68,(ConstIterator *)&local_78);
      if (bVar1) {
        std::error_code::error_code<llvm::errc,void>((error_code *)&E.Abbr,invalid_argument);
        EC_00._M_cat._0_4_ = E.Abbr._0_4_;
        EC_00._0_8_ = &local_80;
        EC_00._M_cat._4_4_ = 0;
        createStringError(EC_00,local_88);
        Expected<llvm::DWARFDebugNames::Entry>::Expected(__return_storage_ptr__,&local_80);
        Error::~Error(&local_80);
      }
      else {
        Abbr = detail::
               DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
               ::ConstIterator::operator*((ConstIterator *)local_68);
        DWARFDebugNames::Entry::Entry((Entry *)local_148,this,Abbr);
        __range1._4_4_ = (FormParams)(uint)(this->Hdr).super_HeaderPOD.Version;
        __begin1 = (iterator)&E;
        __end1 = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)__begin1);
        Value = SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::end
                          ((SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *)__begin1);
        for (; __end1 != Value; __end1 = __end1 + 1) {
          local_170 = __end1;
          local_174 = __range1._4_4_;
          bVar1 = DWARFFormValue::extractValue
                            (__end1,local_28,(uint64_t *)AS,__range1._4_4_,(DWARFContext *)0x0,
                             (DWARFUnit *)0x0);
          if (!bVar1) {
            std::error_code::error_code<llvm::errc,void>(&local_190,io_error);
            EC_01._M_cat._0_4_ = local_190._M_value;
            EC_01._0_8_ = &local_180;
            EC_01._M_cat._4_4_ = 0;
            createStringError(EC_01,(char *)local_190._M_cat);
            Expected<llvm::DWARFDebugNames::Entry>::Expected(__return_storage_ptr__,&local_180);
            Error::~Error(&local_180);
            goto LAB_027a8e60;
          }
        }
        Expected<llvm::DWARFDebugNames::Entry>::Expected<llvm::DWARFDebugNames::Entry>
                  (__return_storage_ptr__,(Entry *)local_148,(type *)0x0);
LAB_027a8e60:
        DWARFDebugNames::Entry::~Entry((Entry *)local_148);
      }
    }
  }
  else {
    std::error_code::error_code<llvm::errc,void>(&local_40,illegal_byte_sequence);
    EC._M_cat._0_4_ = local_40._M_value;
    EC._0_8_ = &local_30;
    EC._M_cat._4_4_ = 0;
    createStringError(EC,(char *)local_40._M_cat);
    Expected<llvm::DWARFDebugNames::Entry>::Expected(__return_storage_ptr__,&local_30);
    Error::~Error(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFDebugNames::Entry>
DWARFDebugNames::NameIndex::getEntry(uint64_t *Offset) const {
  const DWARFDataExtractor &AS = Section.AccelSection;
  if (!AS.isValidOffset(*Offset))
    return createStringError(errc::illegal_byte_sequence,
                             "Incorrectly terminated entry list.");

  uint32_t AbbrevCode = AS.getULEB128(Offset);
  if (AbbrevCode == 0)
    return make_error<SentinelError>();

  const auto AbbrevIt = Abbrevs.find_as(AbbrevCode);
  if (AbbrevIt == Abbrevs.end())
    return createStringError(errc::invalid_argument, "Invalid abbreviation.");

  Entry E(*this, *AbbrevIt);

  dwarf::FormParams FormParams = {Hdr.Version, 0, dwarf::DwarfFormat::DWARF32};
  for (auto &Value : E.Values) {
    if (!Value.extractValue(AS, Offset, FormParams))
      return createStringError(errc::io_error,
                               "Error extracting index attribute values.");
  }
  return std::move(E);
}